

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
cmGeneratorTarget::GetIncludeDirectories
          (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,cmGeneratorTarget *this,string *config,string *lang)

{
  bool bVar1;
  cmMakefile *pcVar2;
  pointer pcVar3;
  cmLinkImplItem *this_00;
  cmGeneratorTarget *pcVar4;
  string *psVar5;
  cmLocalGenerator *pcVar6;
  pointer this_01;
  bool *pbVar7;
  bool bVar8;
  int iVar9;
  PolicyStatus PVar10;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var11;
  cmValue __args;
  cmLinkImplementationLibraries *pcVar12;
  string *psVar13;
  string *psVar14;
  ostream *poVar15;
  string *psVar16;
  long *plVar17;
  cmake *this_02;
  size_type *psVar18;
  long *plVar19;
  PolicyID id;
  PolicyID id_00;
  pointer this_03;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_04;
  pointer pEVar20;
  MessageType MVar21;
  bool bVar22;
  bool bVar23;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar24;
  string_view value;
  string local_388;
  string propertyName;
  long *local_330;
  long local_328;
  long local_320 [2];
  pointer local_310;
  PolicyMap *local_308;
  EvaluatedTargetPropertyEntries entries;
  long local_2e0;
  long *local_2d8;
  long local_2d0;
  long local_2c8;
  long lStack_2c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  debugProperties;
  string obj_dir;
  ios_base local_230 [264];
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_128;
  pointer local_118;
  cmListFileBacktrace *local_110;
  string local_108;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uniqueIncludes;
  cmGeneratorExpressionDAGChecker dagChecker;
  
  (__return_storage_ptr__->
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uniqueIncludes._M_h._M_buckets = &uniqueIncludes._M_h._M_single_bucket;
  uniqueIncludes._M_h._M_bucket_count = 1;
  uniqueIncludes._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  uniqueIncludes._M_h._M_element_count = 0;
  uniqueIncludes._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  uniqueIncludes._M_h._M_rehash_policy._M_next_resize = 0;
  uniqueIncludes._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"INCLUDE_DIRECTORIES","");
  cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
            (&dagChecker,this,&local_108,(GeneratorExpressionContent *)0x0,
             (cmGeneratorExpressionDAGChecker *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  debugProperties.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  debugProperties.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  debugProperties.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar2 = this->Makefile;
  obj_dir._M_dataplus._M_p = (pointer)&obj_dir.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&obj_dir,"CMAKE_DEBUG_TARGET_PROPERTIES","");
  cmMakefile::GetDefExpandList(pcVar2,&obj_dir,&debugProperties,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)obj_dir._M_dataplus._M_p != &obj_dir.field_2) {
    operator_delete(obj_dir._M_dataplus._M_p,obj_dir.field_2._M_allocated_capacity + 1);
  }
  if (this->DebugIncludesDone == false) {
    _Var11 = std::
             __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[20]>>
                       (debugProperties.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        debugProperties.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish,"INCLUDE_DIRECTORIES");
    bVar22 = _Var11._M_current !=
             debugProperties.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    bVar22 = false;
  }
  if (this->GlobalGenerator->ConfigureDoneCMP0026AndCMP0024 == true) {
    this->DebugIncludesDone = true;
  }
  anon_unknown.dwarf_164fc7f::EvaluateTargetPropertyEntries
            (&entries,this,config,lang,&dagChecker,&this->IncludeDirectoriesEntries);
  iVar9 = std::__cxx11::string::compare((char *)lang);
  if (iVar9 == 0) {
    obj_dir._M_dataplus._M_p = (pointer)&obj_dir.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&obj_dir,"Swift_MODULE_DIRECTORY","");
    anon_unknown.dwarf_164fc7f::AddLangSpecificImplicitIncludeDirectories
              (this,lang,config,&obj_dir,BINARY,&entries);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)obj_dir._M_dataplus._M_p != &obj_dir.field_2) {
      operator_delete(obj_dir._M_dataplus._M_p,obj_dir.field_2._M_allocated_capacity + 1);
    }
  }
  bVar8 = cmTarget::CanCompileSources(this->Target);
  if (((bVar8) && (iVar9 = std::__cxx11::string::compare((char *)lang), iVar9 != 0)) &&
     (iVar9 = std::__cxx11::string::compare((char *)lang), iVar9 != 0)) {
    propertyName._M_dataplus._M_p = (pointer)&propertyName.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&propertyName,"ISPC_HEADER_DIRECTORY","");
    GetAllConfigCompileLanguages_abi_cxx11_
              ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&obj_dir,this);
    bVar8 = ::cm::
            contains<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char[5],_0>
                      ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&obj_dir,(char (*) [5])"ISPC");
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&obj_dir);
    if (bVar8) {
      __args = GetProperty(this,&propertyName);
      if (__args.Value == (string *)0x0) {
        (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x16])
                  (&obj_dir,this->GlobalGenerator,&this->ObjectDirectory,config);
        std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
        emplace_back<std::__cxx11::string>
                  ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                   __return_storage_ptr__,&obj_dir);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)obj_dir._M_dataplus._M_p != &obj_dir.field_2) {
          operator_delete(obj_dir._M_dataplus._M_p,obj_dir.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
        emplace_back<std::__cxx11::string_const&>
                  ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                   __return_storage_ptr__,__args.Value);
      }
    }
    obj_dir._M_dataplus._M_p = (pointer)&obj_dir.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&obj_dir,"ISPC","");
    anon_unknown.dwarf_164fc7f::AddLangSpecificImplicitIncludeDirectories
              (this,&obj_dir,config,&propertyName,OBJECT,&entries);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)obj_dir._M_dataplus._M_p != &obj_dir.field_2) {
      operator_delete(obj_dir._M_dataplus._M_p,obj_dir.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)propertyName._M_dataplus._M_p != &propertyName.field_2) {
      operator_delete(propertyName._M_dataplus._M_p,
                      CONCAT71(propertyName.field_2._M_allocated_capacity._1_7_,
                               propertyName.field_2._M_local_buf[0]) + 1);
    }
  }
  obj_dir._M_dataplus._M_p = (pointer)&obj_dir.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&obj_dir,"INTERFACE_INCLUDE_DIRECTORIES","");
  anon_unknown.dwarf_164fc7f::AddInterfaceEntries
            (this,config,&obj_dir,lang,&dagChecker,&entries,Yes,Usage);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)obj_dir._M_dataplus._M_p != &obj_dir.field_2) {
    operator_delete(obj_dir._M_dataplus._M_p,obj_dir.field_2._M_allocated_capacity + 1);
  }
  pcVar2 = this->Makefile;
  obj_dir._M_dataplus._M_p = (pointer)&obj_dir.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&obj_dir,"APPLE","");
  bVar8 = cmMakefile::IsOn(pcVar2,&obj_dir);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)obj_dir._M_dataplus._M_p != &obj_dir.field_2) {
    operator_delete(obj_dir._M_dataplus._M_p,obj_dir.field_2._M_allocated_capacity + 1);
  }
  if ((bVar8) &&
     (pcVar12 = GetLinkImplementationLibrariesInternal(this,config,this,Usage),
     pcVar12 != (cmLinkImplementationLibraries *)0x0)) {
    this_03 = (pcVar12->Libraries).
              super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
              super__Vector_impl_data._M_start;
    pcVar3 = (pcVar12->Libraries).
             super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (this_03 != pcVar3) {
      do {
        psVar13 = cmLinkItem::AsStr_abi_cxx11_(&this_03->super_cmLinkItem);
        psVar14 = cmMakefile::GetHomeOutputDirectory_abi_cxx11_(this->Makefile);
        cmsys::SystemTools::CollapseFullPath(&propertyName,psVar13,psVar14);
        if ((GetIncludeDirectories(std::__cxx11::string_const&,std::__cxx11::string_const&)::
             frameworkCheck == '\0') &&
           (iVar9 = __cxa_guard_acquire(&GetIncludeDirectories(std::__cxx11::string_const&,std::__cxx11::string_const&)
                                         ::frameworkCheck), iVar9 != 0)) {
          GetIncludeDirectories::frameworkCheck.regmust = (char *)0x0;
          GetIncludeDirectories::frameworkCheck.program = (char *)0x0;
          GetIncludeDirectories::frameworkCheck.progsize = 0;
          memset(&GetIncludeDirectories::frameworkCheck,0,0xaa);
          cmsys::RegularExpression::compile
                    (&GetIncludeDirectories::frameworkCheck,
                     "(.*\\.framework)(/Versions/[^/]+)?/[^/]+$");
          __cxa_atexit(cmsys::RegularExpression::~RegularExpression,
                       &GetIncludeDirectories::frameworkCheck,&__dso_handle);
          __cxa_guard_release(&GetIncludeDirectories(std::__cxx11::string_const&,std::__cxx11::string_const&)
                               ::frameworkCheck);
        }
        bVar8 = cmsys::RegularExpression::find
                          (&GetIncludeDirectories::frameworkCheck,propertyName._M_dataplus._M_p,
                           &GetIncludeDirectories::frameworkCheck.regmatch);
        if (bVar8) {
          if (GetIncludeDirectories::frameworkCheck.regmatch.startp[1] == (char *)0x0) {
            obj_dir._M_dataplus._M_p = (pointer)&obj_dir.field_2;
            obj_dir._M_string_length = 0;
            obj_dir.field_2._M_allocated_capacity =
                 obj_dir.field_2._M_allocated_capacity & 0xffffffffffffff00;
          }
          else {
            obj_dir._M_dataplus._M_p = (pointer)&obj_dir.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&obj_dir,GetIncludeDirectories::frameworkCheck.regmatch.startp[1],
                       GetIncludeDirectories::frameworkCheck.regmatch.endp[1]);
          }
          std::__cxx11::string::operator=((string *)&propertyName,(string *)&obj_dir);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)obj_dir._M_dataplus._M_p != &obj_dir.field_2) {
            operator_delete(obj_dir._M_dataplus._M_p,obj_dir.field_2._M_allocated_capacity + 1);
          }
          local_128.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          local_128.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack(&local_128);
          obj_dir._M_string_length =
               (size_type)
               local_128.TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
          obj_dir.field_2._M_allocated_capacity =
               (size_type)
               local_128.TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
          local_128.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          local_128.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          obj_dir.field_2._8_8_ = 0;
          obj_dir._M_dataplus._M_p = (pointer)this_03;
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     (obj_dir.field_2._M_local_buf + 8),&propertyName);
          std::
          vector<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
          ::emplace_back<(anonymous_namespace)::EvaluatedTargetPropertyEntry>
                    (&entries.Entries,(EvaluatedTargetPropertyEntry *)&obj_dir);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(obj_dir.field_2._M_local_buf + 8));
          if (obj_dir.field_2._M_allocated_capacity != 0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       obj_dir.field_2._M_allocated_capacity);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)propertyName._M_dataplus._M_p != &propertyName.field_2) {
          operator_delete(propertyName._M_dataplus._M_p,
                          CONCAT71(propertyName.field_2._M_allocated_capacity._1_7_,
                                   propertyName.field_2._M_local_buf[0]) + 1);
        }
        this_03 = this_03 + 1;
      } while (this_03 != pcVar3);
    }
  }
  local_118 = entries.Entries.
              super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (entries.Entries.
      super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      entries.Entries.
      super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_308 = &this->PolicyMap;
    pEVar20 = entries.Entries.
              super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      this_00 = pEVar20->LinkImplItem;
      psVar13 = cmLinkItem::AsStr_abi_cxx11_(&this_00->super_cmLinkItem);
      pcVar4 = (this_00->super_cmLinkItem).Target;
      if (pcVar4 == (cmGeneratorTarget *)0x0) {
        bVar8 = false;
      }
      else {
        bVar8 = cmTarget::IsImported(pcVar4->Target);
      }
      bVar1 = this_00->CheckCMP0027;
      propertyName._M_dataplus._M_p = (pointer)&propertyName.field_2;
      propertyName._M_string_length = 0;
      propertyName.field_2._M_local_buf[0] = '\0';
      psVar14 = (pEVar20->Values).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      psVar5 = (pEVar20->Values).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      bVar23 = psVar14 == psVar5;
      local_310 = pEVar20;
      if (!bVar23) {
        local_110 = &pEVar20->Backtrace;
        do {
          if ((bVar8 != false) && (bVar23 = cmsys::SystemTools::FileExists(psVar14), !bVar23)) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&obj_dir);
            MVar21 = FATAL_ERROR;
            if (bVar1 != false) {
              PVar10 = cmPolicies::PolicyMap::Get(local_308,CMP0027);
              if (PVar10 != OLD) {
                if (PVar10 != WARN) goto LAB_003dec92;
                cmPolicies::GetPolicyWarning_abi_cxx11_(&local_388,(cmPolicies *)0x1b,id_00);
                poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&obj_dir,local_388._M_dataplus._M_p,
                                     local_388._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\n",1);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_388._M_dataplus._M_p != &local_388.field_2) {
                  operator_delete(local_388._M_dataplus._M_p,
                                  local_388.field_2._M_allocated_capacity + 1);
                }
              }
              MVar21 = AUTHOR_WARNING;
            }
LAB_003dec92:
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&obj_dir,"Imported target \"",0x11);
            poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&obj_dir,(psVar13->_M_dataplus)._M_p,
                                 psVar13->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar15,"\" includes non-existent path\n  \"",0x20);
            poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar15,(psVar14->_M_dataplus)._M_p,psVar14->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar15,
                       "\"\nin its INTERFACE_INCLUDE_DIRECTORIES. Possible reasons include:\n* The path was deleted, renamed, or moved to another location.\n* An install or uninstall procedure did not complete successfully.\n* The installation package was faulty and references files it does not provide.\n"
                       ,0x114);
            pcVar6 = this->LocalGenerator;
            std::__cxx11::stringbuf::str();
            cmLocalGenerator::IssueMessage(pcVar6,MVar21,&local_388);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_388._M_dataplus._M_p != &local_388.field_2) {
              operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1
                             );
            }
LAB_003ded47:
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&obj_dir);
            std::ios_base::~ios_base(local_230);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)propertyName._M_dataplus._M_p != &propertyName.field_2) {
              operator_delete(propertyName._M_dataplus._M_p,
                              CONCAT71(propertyName.field_2._M_allocated_capacity._1_7_,
                                       propertyName.field_2._M_local_buf[0]) + 1);
            }
            goto LAB_003ded84;
          }
          bVar23 = cmsys::SystemTools::FileIsFullPath(psVar14);
          if (!bVar23) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&obj_dir);
            if (psVar13->_M_string_length == 0) {
              PVar10 = cmPolicies::PolicyMap::Get(local_308,CMP0021);
              MVar21 = FATAL_ERROR;
              if (PVar10 == OLD) {
                bVar23 = true;
              }
              else {
                if (PVar10 == WARN) {
                  cmPolicies::GetPolicyWarning_abi_cxx11_(&local_388,(cmPolicies *)0x15,id);
                  poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&obj_dir,local_388._M_dataplus._M_p,
                                       local_388._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\n",1);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_388._M_dataplus._M_p != &local_388.field_2) {
                    operator_delete(local_388._M_dataplus._M_p,
                                    local_388.field_2._M_allocated_capacity + 1);
                  }
                  MVar21 = AUTHOR_WARNING;
                }
                bVar23 = false;
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&obj_dir,
                         "Found relative path while evaluating include directories of \"",0x3d);
              psVar16 = cmTarget::GetName_abi_cxx11_(this->Target);
              poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&obj_dir,(psVar16->_M_dataplus)._M_p,
                                   psVar16->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\":\n  \"",6);
              poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar15,(psVar14->_M_dataplus)._M_p,psVar14->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\"\n",2);
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&obj_dir,"Target \"",8);
              poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&obj_dir,(psVar13->_M_dataplus)._M_p,
                                   psVar13->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar15,
                         "\" contains relative path in its INTERFACE_INCLUDE_DIRECTORIES:\n  \"",
                         0x42);
              poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar15,(psVar14->_M_dataplus)._M_p,psVar14->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\"",1);
              MVar21 = FATAL_ERROR;
              bVar23 = false;
            }
            if (!bVar23) {
              pcVar6 = this->LocalGenerator;
              std::__cxx11::stringbuf::str();
              cmLocalGenerator::IssueMessage(pcVar6,MVar21,&local_388);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_388._M_dataplus._M_p != &local_388.field_2) {
                operator_delete(local_388._M_dataplus._M_p,
                                local_388.field_2._M_allocated_capacity + 1);
              }
              if (MVar21 == FATAL_ERROR) goto LAB_003ded47;
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&obj_dir);
            std::ios_base::~ios_base(local_230);
          }
          value._M_str = (psVar14->_M_dataplus)._M_p;
          value._M_len = psVar14->_M_string_length;
          bVar23 = cmValue::IsOff(value);
          if (!bVar23) {
            cmsys::SystemTools::ConvertToUnixSlashes(psVar14);
          }
          obj_dir._M_dataplus._M_p = (pointer)&uniqueIncludes;
          pVar24 = std::
                   _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                   ::
                   _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                             ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                               *)obj_dir._M_dataplus._M_p,psVar14,&obj_dir);
          if ((((undefined1  [16])pVar24 & (undefined1  [16])0x1) != (undefined1  [16])0x0) &&
             (std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
              emplace_back<std::__cxx11::string&,cmListFileBacktrace&>
                        ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                          *)__return_storage_ptr__,psVar14,local_110), bVar22)) {
            std::operator+(&local_388," * ",psVar14);
            plVar17 = (long *)std::__cxx11::string::append((char *)&local_388);
            obj_dir._M_dataplus._M_p = (pointer)&obj_dir.field_2;
            psVar18 = (size_type *)(plVar17 + 2);
            if ((size_type *)*plVar17 == psVar18) {
              obj_dir.field_2._M_allocated_capacity = *psVar18;
              obj_dir.field_2._8_8_ = plVar17[3];
            }
            else {
              obj_dir.field_2._M_allocated_capacity = *psVar18;
              obj_dir._M_dataplus._M_p = (pointer)*plVar17;
            }
            obj_dir._M_string_length = plVar17[1];
            *plVar17 = (long)psVar18;
            plVar17[1] = 0;
            *(undefined1 *)(plVar17 + 2) = 0;
            std::__cxx11::string::_M_append((char *)&propertyName,(ulong)obj_dir._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)obj_dir._M_dataplus._M_p != &obj_dir.field_2) {
              operator_delete(obj_dir._M_dataplus._M_p,obj_dir.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_388._M_dataplus._M_p != &local_388.field_2) {
              operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1
                             );
            }
          }
          psVar14 = psVar14 + 1;
          bVar23 = psVar14 == psVar5;
        } while (!bVar23);
      }
      pEVar20 = local_310;
      if (propertyName._M_string_length != 0) {
        this_02 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
        local_330 = local_320;
        local_2e0 = 0x19;
        local_330 = (long *)std::__cxx11::string::_M_create((ulong *)&local_330,(ulong)&local_2e0);
        local_320[0] = local_2e0;
        builtin_strncpy((char *)((long)local_330 + 9),"udes for",8);
        builtin_strncpy((char *)((long)local_330 + 0x11)," target ",8);
        *local_330 = 0x636e692064657355;
        local_330[1] = 0x6f6620736564756c;
        local_328 = local_2e0;
        *(char *)((long)local_330 + local_2e0) = '\0';
        psVar13 = cmTarget::GetName_abi_cxx11_(this->Target);
        plVar17 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_330,(ulong)(psVar13->_M_dataplus)._M_p);
        plVar19 = plVar17 + 2;
        if ((long *)*plVar17 == plVar19) {
          local_2c8 = *plVar19;
          lStack_2c0 = plVar17[3];
          local_2d8 = &local_2c8;
        }
        else {
          local_2c8 = *plVar19;
          local_2d8 = (long *)*plVar17;
        }
        local_2d0 = plVar17[1];
        *plVar17 = (long)plVar19;
        plVar17[1] = 0;
        *(undefined1 *)(plVar17 + 2) = 0;
        plVar17 = (long *)std::__cxx11::string::append((char *)&local_2d8);
        local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
        psVar18 = (size_type *)(plVar17 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar17 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar18) {
          local_388.field_2._M_allocated_capacity = *psVar18;
          local_388.field_2._8_8_ = plVar17[3];
        }
        else {
          local_388.field_2._M_allocated_capacity = *psVar18;
          local_388._M_dataplus._M_p = (pointer)*plVar17;
        }
        local_388._M_string_length = plVar17[1];
        *plVar17 = (long)psVar18;
        plVar17[1] = 0;
        *(undefined1 *)(plVar17 + 2) = 0;
        plVar17 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_388,(ulong)propertyName._M_dataplus._M_p);
        obj_dir._M_dataplus._M_p = (pointer)&obj_dir.field_2;
        psVar18 = (size_type *)(plVar17 + 2);
        if ((size_type *)*plVar17 == psVar18) {
          obj_dir.field_2._M_allocated_capacity = *psVar18;
          obj_dir.field_2._8_8_ = plVar17[3];
        }
        else {
          obj_dir.field_2._M_allocated_capacity = *psVar18;
          obj_dir._M_dataplus._M_p = (pointer)*plVar17;
        }
        obj_dir._M_string_length = plVar17[1];
        *plVar17 = (long)psVar18;
        plVar17[1] = 0;
        *(undefined1 *)(plVar17 + 2) = 0;
        cmake::IssueMessage(this_02,LOG,&obj_dir,&pEVar20->Backtrace);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)obj_dir._M_dataplus._M_p != &obj_dir.field_2) {
          operator_delete(obj_dir._M_dataplus._M_p,obj_dir.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_388._M_dataplus._M_p != &local_388.field_2) {
          operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
        }
        if (local_2d8 != &local_2c8) {
          operator_delete(local_2d8,local_2c8 + 1);
        }
        if (local_330 != local_320) {
          operator_delete(local_330,local_320[0] + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)propertyName._M_dataplus._M_p != &propertyName.field_2) {
        operator_delete(propertyName._M_dataplus._M_p,
                        CONCAT71(propertyName.field_2._M_allocated_capacity._1_7_,
                                 propertyName.field_2._M_local_buf[0]) + 1);
      }
      pEVar20 = pEVar20 + 1;
    } while ((bool)(bVar23 & pEVar20 != local_118));
  }
LAB_003ded84:
  if (entries.Entries.
      super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      entries.Entries.
      super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    this_04 = &(entries.Entries.
                super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
                ._M_impl.super__Vector_impl_data._M_start)->Values;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(this_04);
      this_01 = (pointer)(((EvaluatedTargetPropertyEntry *)(this_04 + -1))->Backtrace).
                         super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                         super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
      if (this_01 != (pointer)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
      }
      pbVar7 = (bool *)(this_04 + 1);
      this_04 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&this_04[2].
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
    } while ((pointer)(pbVar7 + 8) !=
             entries.Entries.
             super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (entries.Entries.
      super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(entries.Entries.
                    super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)entries.Entries.
                          super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)entries.Entries.
                          super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&debugProperties);
  if (dagChecker.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (dagChecker.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
               TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  std::
  _Rb_tree<const_cmGeneratorTarget_*,_std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~_Rb_tree(&dagChecker.Seen._M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)dagChecker.Property._M_dataplus._M_p != &dagChecker.Property.field_2) {
    operator_delete(dagChecker.Property._M_dataplus._M_p,
                    dagChecker.Property.field_2._M_allocated_capacity + 1);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&uniqueIncludes._M_h);
  return __return_storage_ptr__;
}

Assistant:

std::vector<BT<std::string>> cmGeneratorTarget::GetIncludeDirectories(
  const std::string& config, const std::string& lang) const
{
  std::vector<BT<std::string>> includes;
  std::unordered_set<std::string> uniqueIncludes;

  cmGeneratorExpressionDAGChecker dagChecker(this, "INCLUDE_DIRECTORIES",
                                             nullptr, nullptr);

  std::vector<std::string> debugProperties;
  this->Makefile->GetDefExpandList("CMAKE_DEBUG_TARGET_PROPERTIES",
                                   debugProperties);

  bool debugIncludes = !this->DebugIncludesDone &&
    cm::contains(debugProperties, "INCLUDE_DIRECTORIES");

  if (this->GlobalGenerator->GetConfigureDoneCMP0026()) {
    this->DebugIncludesDone = true;
  }

  EvaluatedTargetPropertyEntries entries = EvaluateTargetPropertyEntries(
    this, config, lang, &dagChecker, this->IncludeDirectoriesEntries);

  if (lang == "Swift") {
    AddLangSpecificImplicitIncludeDirectories(
      this, lang, config, "Swift_MODULE_DIRECTORY",
      IncludeDirectoryFallBack::BINARY, entries);
  }

  if (this->CanCompileSources() && (lang != "Swift" && lang != "Fortran")) {

    const std::string propertyName = "ISPC_HEADER_DIRECTORY";

    // If this target has ISPC sources make sure to add the header
    // directory to other compilation units
    if (cm::contains(this->GetAllConfigCompileLanguages(), "ISPC")) {
      if (cmValue val = this->GetProperty(propertyName)) {
        includes.emplace_back(*val);
      } else {
        includes.emplace_back(this->GetObjectDirectory(config));
      }
    }

    AddLangSpecificImplicitIncludeDirectories(
      this, "ISPC", config, propertyName, IncludeDirectoryFallBack::OBJECT,
      entries);
  }

  AddInterfaceEntries(this, config, "INTERFACE_INCLUDE_DIRECTORIES", lang,
                      &dagChecker, entries, IncludeRuntimeInterface::Yes);

  if (this->Makefile->IsOn("APPLE")) {
    if (cmLinkImplementationLibraries const* impl =
          this->GetLinkImplementationLibraries(config,
                                               LinkInterfaceFor::Usage)) {
      for (cmLinkImplItem const& lib : impl->Libraries) {
        std::string libDir = cmSystemTools::CollapseFullPath(
          lib.AsStr(), this->Makefile->GetHomeOutputDirectory());

        static cmsys::RegularExpression frameworkCheck(
          "(.*\\.framework)(/Versions/[^/]+)?/[^/]+$");
        if (!frameworkCheck.find(libDir)) {
          continue;
        }

        libDir = frameworkCheck.match(1);

        EvaluatedTargetPropertyEntry ee(lib, cmListFileBacktrace());
        ee.Values.emplace_back(std::move(libDir));
        entries.Entries.emplace_back(std::move(ee));
      }
    }
  }

  processIncludeDirectories(this, entries, includes, uniqueIncludes,
                            debugIncludes);

  return includes;
}